

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  int iVar1;
  size_t sVar2;
  long lVar3;
  void *in_RDI;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  ZSTD_strategy in_stack_00000020;
  
  if (in_RDI == (void *)0x0) {
    uRam0000000000000004 = CONCAT44(in_stack_0000000c,in_stack_00000008);
    uRam0000000000000018 = CONCAT44(in_stack_00000020,in_stack_0000001c);
    _DAT_00000014 = in_stack_00000018;
    uRam000000000000000c = in_stack_00000010;
    uRam0000000000000010 = in_stack_00000014;
    if (_DAT_00000060 == 0) goto LAB_0076156e;
    if (_DAT_00000060 != 1) goto LAB_007615d1;
  }
  else {
    memset(in_RDI,0,0xd0);
    *(undefined4 *)((long)in_RDI + 0x2c) = 3;
    *(undefined4 *)((long)in_RDI + 0x20) = 1;
    *(ulong *)((long)in_RDI + 4) = CONCAT44(in_stack_0000000c,in_stack_00000008);
    *(ulong *)((long)in_RDI + 0xc) = CONCAT44(in_stack_00000014,in_stack_00000010);
    *(ulong *)((long)in_RDI + 0x10) = CONCAT44(in_stack_00000018,in_stack_00000014);
    *(ulong *)((long)in_RDI + 0x18) = CONCAT44(in_stack_00000020,in_stack_0000001c);
LAB_0076156e:
    if ((in_stack_00000020 < ZSTD_btopt) || (in_stack_00000008 < 0x1b)) {
      *(undefined4 *)((long)in_RDI + 0x60) = 2;
      goto LAB_007615d1;
    }
    *(undefined4 *)((long)in_RDI + 0x60) = 1;
  }
  ZSTD_ldm_adjustParameters
            ((ldmParams_t *)((long)in_RDI + 0x60),(ZSTD_compressionParameters *)&stack0x00000008);
  if (*(uint *)((long)in_RDI + 100) < *(uint *)((long)in_RDI + 0x68)) {
    __assert_fail("cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x141,
                  "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
  }
  if (0x1f < *(uint *)((long)in_RDI + 0x70)) {
    __assert_fail("cctxParams.ldmParams.hashRateLog < 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x142,
                  "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
  }
LAB_007615d1:
  iVar1 = *(int *)((long)in_RDI + 0x8c);
  if ((iVar1 == 0) && (iVar1 = 2, ZSTD_btlazy2 < in_stack_00000020)) {
    iVar1 = (in_stack_00000008 < 0x11) + 1;
  }
  *(int *)((long)in_RDI + 0x8c) = iVar1;
  iVar1 = *(int *)((long)in_RDI + 0x90);
  if ((iVar1 == 0) && (iVar1 = 2, 0xfffffffc < in_stack_00000020 - ZSTD_btlazy2)) {
    iVar1 = (in_stack_00000008 < 0xf) + 1;
  }
  *(int *)((long)in_RDI + 0x90) = iVar1;
  lVar3 = 0x20000;
  if (*(long *)((long)in_RDI + 0xc0) != 0) {
    lVar3 = *(long *)((long)in_RDI + 0xc0);
  }
  *(long *)((long)in_RDI + 0xc0) = lVar3;
  iVar1 = (*(int *)((long)in_RDI + 0x2c) < 10) + 1;
  if (*(int *)((long)in_RDI + 200) != 0) {
    iVar1 = *(int *)((long)in_RDI + 200);
  }
  *(int *)((long)in_RDI + 200) = iVar1;
  cParams_00.chainLog = in_stack_0000000c;
  cParams_00.windowLog = in_stack_00000008;
  cParams_00.strategy = in_stack_00000020;
  cParams_00.targetLength = in_stack_0000001c;
  cParams_00.hashLog = in_stack_00000010;
  cParams_00.searchLog = in_stack_00000014;
  cParams_00.minMatch = in_stack_00000018;
  sVar2 = ZSTD_checkCParams(cParams_00);
  if (sVar2 == 0) {
    return (ZSTD_CCtx_params *)0x0;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x14a,"ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)"
               );
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    cctxParams.ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams.ldmParams.enableLdm, &cParams);
    if (cctxParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }
    cctxParams.useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams.useBlockSplitter, &cParams);
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    cctxParams.validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams.validateSequences);
    cctxParams.maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams.maxBlockSize);
    cctxParams.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams.searchForExternalRepcodes,
                                                                             cctxParams.compressionLevel);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}